

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzmatrix.cpp
# Opt level: O1

int __thiscall
TPZMatrix<TPZFlopCounter>::GetSub
          (TPZMatrix<TPZFlopCounter> *this,int64_t sRow,int64_t sCol,int64_t rowSize,int64_t colSize
          ,TPZFMatrix<TPZFlopCounter> *A)

{
  int iVar1;
  long lVar2;
  long lVar3;
  undefined1 local_38 [8];
  
  if ((rowSize + sRow <= (this->super_TPZBaseMatrix).fRow) &&
     (colSize + sCol <= (this->super_TPZBaseMatrix).fCol)) {
    (*(A->super_TPZMatrix<TPZFlopCounter>).super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable
      [0xd])(A,rowSize,colSize);
    if (0 < rowSize) {
      lVar3 = 0;
      do {
        if (0 < colSize) {
          lVar2 = 0;
          do {
            (*(this->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0x24])
                      (this,sRow,sCol + lVar2);
            (*(A->super_TPZMatrix<TPZFlopCounter>).super_TPZBaseMatrix.super_TPZSavable.
              _vptr_TPZSavable[0x23])(A,lVar3,lVar2,local_38);
            lVar2 = lVar2 + 1;
          } while (colSize != lVar2);
        }
        lVar3 = lVar3 + 1;
        sRow = sRow + 1;
      } while (lVar3 != rowSize);
    }
    return 1;
  }
  iVar1 = Error("GetSub <t.he sub-matrix is too big>",(char *)0x0);
  return iVar1;
}

Assistant:

int TPZMatrix<TVar>::GetSub(const int64_t sRow,const int64_t sCol,const int64_t rowSize,
							const int64_t colSize, TPZFMatrix<TVar> & A ) const {
    if ( ((sRow + rowSize) > Rows()) || ((sCol + colSize) > Cols()) ) {
        return( Error( "GetSub <t.he sub-matrix is too big>" ) );
    }
    A.Resize( rowSize, colSize );
    int64_t row = sRow;
    for ( int64_t r = 0; r < rowSize; r++, row++ ) {
        int64_t col = sCol;
        for ( int64_t c = 0; c < colSize; c++, col++ ) {
            A.PutVal( r, c, GetVal( row, col ) );
        }
    }
    return( 1 );
}